

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

Token * __thiscall EOPlus::Lexer::ReadString(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  Lexer_Error *this_00;
  variant local_130;
  undefined1 local_ea;
  allocator<char> local_e9;
  string local_e8;
  undefined4 local_c4;
  variant local_c0;
  anon_class_1_0_00000001 local_69;
  function<bool_(char)> local_68;
  byte local_41;
  undefined1 local_40 [7];
  bool escape;
  string s;
  char c;
  Lexer *this_local;
  
  s.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_40);
  local_41 = 0;
  std::function<bool(char)>::function<EOPlus::Lexer::ReadString()::__0,void>
            ((function<bool(char)> *)&local_68,&local_69);
  bVar1 = GetCharIf(this,s.field_2._M_local_buf + 0xf,&local_68);
  std::function<bool_(char)>::~function(&local_68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    while (bVar1 = GetChar(this,s.field_2._M_local_buf + 0xf), bVar1) {
      if ((local_41 & 1) == 0) {
        if (s.field_2._M_local_buf[0xf] == '\\') {
          local_41 = 1;
        }
        else {
          if (s.field_2._M_local_buf[0xf] == '\"') break;
          if (s.field_2._M_local_buf[0xf] == '\n') {
            local_ea = 1;
            this_00 = (Lexer_Error *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"Unterminated string on previous line",&local_e9);
            Lexer_Error::Lexer_Error(this_00,&local_e8,this->row,this->col);
            local_ea = 0;
            __cxa_throw(this_00,&Lexer_Error::typeinfo,Lexer_Error::~Lexer_Error);
          }
          std::__cxx11::string::operator+=((string *)local_40,s.field_2._M_local_buf[0xf]);
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)local_40,s.field_2._M_local_buf[0xf]);
        local_41 = 0;
      }
    }
    util::variant::variant(&local_130,(string *)local_40);
    Token::Token(__return_storage_ptr__,String,&local_130);
    util::variant::~variant(&local_130);
  }
  else {
    util::variant::variant(&local_c0);
    Token::Token(__return_storage_ptr__,Invalid,&local_c0);
    util::variant::~variant(&local_c0);
  }
  local_c4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadString()
	{
		char c = '\0';
		std::string s;
		bool escape = false;

		if (!this->GetCharIf(c, [](char c) { return c == '"'; }))
			return Token();

		while (this->GetChar(c))
		{
			if (escape)
			{
				switch (c)
				{
					// No real need for any explicit escape codes...
					default: s += c; break;
				};

				escape = false;
			}
			else if (c == '\\')
			{
				escape = true;
			}
			else if (c == '"')
			{
				break;
			}
			else if (c == '\n')
			{
				throw Lexer_Error("Unterminated string on previous line", this->row, this->col);
			}
			else
			{
				s += c;
			}
		}

		return Token(Token::String, s);
	}